

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::commoditizedUnit(string *unit_string,precise_unit actUnit,size_t *index)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  const_reference pvVar4;
  long *in_RDX;
  string *in_RSI;
  double in_XMM0_Qa;
  precise_unit pVar5;
  uint32_t hcode;
  string commodStr;
  size_type start;
  size_type ccindex;
  undefined4 in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  precise_unit *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  precise_unit *in_stack_ffffffffffffff50;
  _Alloc_hider in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  precise_unit local_70 [3];
  long local_40;
  long local_38;
  long *local_30;
  double local_20;
  undefined1 local_10 [16];
  
  local_30 = in_RDX;
  local_20 = in_XMM0_Qa;
  sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(in_stack_ffffffffffffff30,(char)(in_stack_ffffffffffffff2c >> 0x18),0x6c47de
                       );
  if (sVar3 == 0xffffffffffffffff) {
    local_10._8_8_ = in_RSI;
    local_10._0_8_ = local_20;
  }
  else {
    local_40 = sVar3 + 1;
    local_38 = local_40;
    segmentcheck((string *)in_stack_ffffffffffffff58._M_p,
                 (char)((ulong)in_stack_ffffffffffffff50 >> 0x38),
                 (size_t *)in_stack_ffffffffffffff48);
    if ((local_38 - local_40 == 2) &&
       (pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_ffffffffffffff30,
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
       *pvVar4 == '#')) {
      *local_30 = local_38;
      local_10 = (undefined1  [16])
                 precise_unit::operator*
                           (in_stack_ffffffffffffff50,(unit *)in_stack_ffffffffffffff48);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_ffffffffffffff48,(size_type)in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      bVar1 = std::operator==(in_stack_ffffffffffffff30,
                              (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
      ;
      if (bVar1) {
        *local_30 = local_38;
        precise_unit::precise_unit
                  (local_70,(double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (precise_unit *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
        local_10 = (undefined1  [16])
                   precise_unit::operator*
                             (in_stack_ffffffffffffff50,(precise_unit *)in_stack_ffffffffffffff48);
      }
      else {
        in_stack_ffffffffffffff30 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff58;
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff68);
        uVar2 = getCommodity(in_RSI);
        std::__cxx11::string::~string(in_stack_ffffffffffffff30);
        *local_30 = local_38;
        precise_unit::precise_unit
                  (in_stack_ffffffffffffff40,(double)CONCAT44(uVar2,in_stack_ffffffffffffff38),
                   (precise_unit *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      }
      std::__cxx11::string::~string(in_stack_ffffffffffffff30);
    }
  }
  pVar5.multiplier_ = (double)local_10._0_8_;
  pVar5.base_units_ = (unit_data)local_10._8_4_;
  pVar5.commodity_ = local_10._12_4_;
  return pVar5;
}

Assistant:

static precise_unit commoditizedUnit(
    const std::string& unit_string,
    precise_unit actUnit,
    size_t& index)
{
    auto ccindex = unit_string.find_first_of('{');
    if (ccindex == std::string::npos) {
        return actUnit;
    }
    ++ccindex;
    auto start = ccindex;
    segmentcheck(unit_string, '}', ccindex);
    if (ccindex - start == 2) {
        // there are a couple units that might look like commodities
        if (unit_string[start] == '#') {
            index = ccindex;
            return actUnit * count;
        }
    }
    std::string commodStr = unit_string.substr(start, ccindex - start - 1);
    if (commodStr == "cells") {
        index = ccindex;
        return actUnit * precise_unit(1.0, precise::count, commodities::cell);
    }
    auto hcode = getCommodity(std::move(commodStr));
    index = ccindex;
    return {1.0, actUnit, hcode};
}